

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

void Abc_NtkCutsOracle(Abc_Ntk_t *pNtk,Cut_Oracle_t *p)

{
  int iVar1;
  int iVar2;
  int Node0;
  int Node1;
  int fCompl0;
  int fCompl1;
  Vec_Int_t *vFanCounts;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  int local_2c;
  int fDrop;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pObj;
  Cut_Oracle_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Cut_OracleReadDrop(p);
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 != 0) {
    if (iVar1 != 0) {
      vFanCounts = Abc_NtkFanoutCounts(pNtk);
      Cut_OracleSetFanoutCounts(p,vFanCounts);
    }
    for (local_2c = 0; iVar2 = Abc_NtkCiNum(pNtk), local_2c < iVar2; local_2c = local_2c + 1) {
      pAVar3 = Abc_NtkCi(pNtk,local_2c);
      iVar2 = Abc_ObjFanoutNum(pAVar3);
      if (0 < iVar2) {
        Cut_OracleNodeSetTriv(p,pAVar3->Id);
      }
    }
    p_00 = Abc_AigDfs(pNtk,0,1);
    for (local_2c = 0; iVar2 = Vec_PtrSize(p_00), local_2c < iVar2; local_2c = local_2c + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_2c);
      iVar2 = Abc_ObjIsCo(pAVar3);
      if (iVar2 == 0) {
        iVar2 = pAVar3->Id;
        Node0 = Abc_ObjFaninId0(pAVar3);
        Node1 = Abc_ObjFaninId1(pAVar3);
        fCompl0 = Abc_ObjFaninC0(pAVar3);
        fCompl1 = Abc_ObjFaninC1(pAVar3);
        Cut_OracleComputeCuts(p,iVar2,Node0,Node1,fCompl0,fCompl1);
        if (iVar1 != 0) {
          iVar2 = Abc_ObjFaninId0(pAVar3);
          Cut_OracleTryDroppingCuts(p,iVar2);
          iVar2 = Abc_ObjFaninId1(pAVar3);
          Cut_OracleTryDroppingCuts(p,iVar2);
        }
      }
      else if (iVar1 != 0) {
        iVar2 = Abc_ObjFaninId0(pAVar3);
        Cut_OracleTryDroppingCuts(p,iVar2);
      }
    }
    Vec_PtrFree(p_00);
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                ,0xeb,"void Abc_NtkCutsOracle(Abc_Ntk_t *, Cut_Oracle_t *)");
}

Assistant:

void Abc_NtkCutsOracle( Abc_Ntk_t * pNtk, Cut_Oracle_t * p )
{
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i; //, clk = Abc_Clock();
    int fDrop = Cut_OracleReadDrop(p);

    assert( Abc_NtkIsStrash(pNtk) );

    // prepare cut droppping
    if ( fDrop )
        Cut_OracleSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );

    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_OracleNodeSetTriv( p, pObj->Id );

    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( fDrop )
                Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        // compute the cuts to the internal node
        Cut_OracleComputeCuts( p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
                Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
        // consider dropping the fanins cuts
        if ( fDrop )
        {
            Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
    }
    Vec_PtrFree( vNodes );
//ABC_PRT( "Total", Abc_Clock() - clk );
//Abc_NtkPrintCuts_( p, pNtk, 0 );
}